

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void duckdb::roaring::RoaringAnalyzeState::HandleRaggedByte
               (RoaringAnalyzeState *state,uint8_t array_index,idx_t relevant_bits)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  idx_t iVar4;
  uint uVar5;
  undefined3 in_register_00000031;
  uint16_t uVar6;
  bool bVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  undefined1 auVar10 [16];
  
  auVar2 = _DAT_01ffd920;
  iVar3 = *(int *)&state->count;
  uVar6 = state->run_count;
  uVar8 = state->one_count;
  uVar9 = state->zero_count;
  bVar1 = state->last_bit_set;
  for (iVar4 = 0; iVar3 = iVar3 + 1, relevant_bits != iVar4; iVar4 = iVar4 + 1) {
    uVar5 = 1 << ((byte)iVar4 & 0x1f) & CONCAT31(in_register_00000031,array_index);
    if ((uVar5 == 0) && ((uint16_t)iVar3 == 1 || (bVar1 & 1) != 0)) {
      uVar6 = uVar6 + 1;
      state->run_count = uVar6;
    }
    bVar7 = uVar5 == 0;
    auVar10._1_7_ = 0;
    auVar10[0] = !bVar7;
    auVar10[8] = bVar7;
    auVar10._9_7_ = 0;
    auVar10 = packssdw(auVar10 & auVar2,auVar10 & auVar2);
    auVar10 = packssdw(auVar10,auVar10);
    uVar8 = uVar8 + auVar10._0_2_;
    uVar9 = uVar9 + auVar10._2_2_;
    state->one_count = uVar8;
    state->zero_count = uVar9;
    state->last_bit_set = !bVar7;
    state->count = (uint16_t)iVar3;
    bVar1 = uVar5 != 0;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::HandleRaggedByte(RoaringAnalyzeState &state, uint8_t array_index, idx_t relevant_bits) {
	D_ASSERT(relevant_bits <= 8);
	for (idx_t i = 0; i < relevant_bits; i++) {
		const bool bit_set = array_index & (1 << i);
		HandleBit(state, bit_set);
	}
}